

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa.c
# Opt level: O1

uint64_t duckdb_je_pa_shard_time_until_deferred_work(tsdn_t *tsdn,pa_shard_t *shard)

{
  uint64_t uVar1;
  uint64_t uVar2;
  
  uVar1 = (*(shard->pac).pai.time_until_deferred_work)(tsdn,&(shard->pac).pai);
  if (uVar1 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = uVar1;
    if ((((shard->use_hpa).repr & 1U) != 0) &&
       (uVar2 = (*(shard->hpa_shard).pai.time_until_deferred_work)(tsdn,&(shard->hpa_shard).pai),
       uVar1 <= uVar2)) {
      uVar2 = uVar1;
    }
  }
  return uVar2;
}

Assistant:

uint64_t
pa_shard_time_until_deferred_work(tsdn_t *tsdn, pa_shard_t *shard) {
	uint64_t time = pai_time_until_deferred_work(tsdn, &shard->pac.pai);
	if (time == BACKGROUND_THREAD_DEFERRED_MIN) {
		return time;
	}

	if (pa_shard_uses_hpa(shard)) {
		uint64_t hpa =
		    pai_time_until_deferred_work(tsdn, &shard->hpa_shard.pai);
		if (hpa < time) {
			time = hpa;
		}
	}
	return time;
}